

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_compilation_errors
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  IProgramContextSupplier *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined1 *this_00;
  char *__s;
  ShaderProgram *pSVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  size_t sVar8;
  LayoutBindingProgram *pLVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  _func_int **pp_Var10;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  LayoutBindingTestResult *pLVar11;
  undefined1 auStack_348 [14];
  allocator<char> local_33a;
  allocator<char> local_339;
  String local_338;
  String local_318;
  LayoutBindingTestResult *local_2f8;
  String local_2f0;
  String local_2d0;
  long *local_2b0 [2];
  long local_2a0 [2];
  String local_290;
  String local_270;
  String local_250;
  String local_230;
  String local_210;
  String local_1f0;
  String decl;
  StringStream s;
  undefined4 extraout_var_00;
  
  decl._M_dataplus._M_p = (pointer)&decl.field_2;
  decl._M_string_length = 0;
  decl.field_2._M_local_buf[0] = '\0';
  puVar3 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70;
  local_2f8 = __return_storage_ptr__;
  std::ios_base::ios_base((ios_base *)puVar3);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       glUniformMatrix3x2fv;
  s.super_ostringstream._328_8_ = 0;
  s.super_ostringstream._336_2_ = 0;
  s.super_ostringstream._344_8_ = 0;
  s.super_ostringstream._352_8_ = 0;
  s.super_ostringstream._360_8_ = 0;
  s.super_ostringstream._368_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__StringStream_020f2a68;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       &PTR__StringStream_020f2a90;
  iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  __s = *(char **)(CONCAT44(extraout_var,iVar6) + 0x10);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_348 +
                         (long)s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream[-3]) + 0x1a0);
  }
  else {
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,__s,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"(0.0);",6);
  std::__cxx11::stringbuf::str();
  setTemplateParam(this,(this->m_stage).type,"UNIFORM_ACCESS",&local_338);
  paVar2 = &local_338.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  StringStream::reset(&s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"layout(binding=0) ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"uniform float tex0;",0x13);
  std::__cxx11::stringbuf::str();
  setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  updateTemplate(this,(this->m_stage).type);
  pIVar1 = &this->super_IProgramContextSupplier;
  iVar6 = (*(this->super_IProgramContextSupplier)._vptr_IProgramContextSupplier[6])(pIVar1);
  pLVar9 = (LayoutBindingProgram *)CONCAT44(extraout_var_00,iVar6);
  iVar6 = (*pLVar9->_vptr_LayoutBindingProgram[2])(pLVar9);
  pSVar5 = pLVar9->m_program;
  if (iVar6 == 2) {
    if (((*pSVar5->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk == true) {
LAB_00bc7a92:
      if ((pSVar5->m_program).m_info.linkOk == true) {
        LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_338,pLVar9,true);
        pLVar11 = local_2f8;
        local_2f8->m_passed = false;
        local_2f8->m_notRunForThisContext = false;
        (local_2f8->m_reason)._M_dataplus._M_p = (pointer)&(local_2f8->m_reason).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f8->m_reason,local_338._M_dataplus._M_p,
                   local_338._M_dataplus._M_p + local_338._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != paVar2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        (*pLVar9->_vptr_LayoutBindingProgram[1])(pLVar9);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base((ios_base *)puVar3);
        goto LAB_00bc8c0c;
      }
    }
  }
  else if (((*pSVar5->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != false)
  goto LAB_00bc7a92;
  (*pLVar9->_vptr_LayoutBindingProgram[1])(pLVar9);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  std::ios_base::~ios_base((ios_base *)puVar3);
  iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,*(char **)CONCAT44(extraout_var_01,iVar6),&local_33a);
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"0.0","");
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x19])
            (&local_250,this,&local_318);
  iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,*(char **)(CONCAT44(extraout_var_02,iVar6) + 0x18),&local_339);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_210,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
            (&local_290,this,&local_210);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_2b0,this,0);
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"float","");
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
            (&local_230,this,local_2b0,&local_2d0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_2f0,this,0);
  paVar4 = &local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_1f0._M_dataplus._M_p = (pointer)paVar4;
  buildUniformDecl((String *)&s,this,&local_338,&local_250,&local_270,&local_290,&local_230,
                   &local_2f0,&local_1f0);
  std::__cxx11::string::operator=((string *)&decl,(string *)&s);
  puVar3 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
      != (_func_int **)puVar3) {
    operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    CONCAT71(s.super_ostringstream.
                             super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                             s.super_ostringstream.
                             super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar4) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,
                    CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                             local_2f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (local_2b0[0] != local_2a0) {
    operator_delete(local_2b0[0],local_2a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
  updateTemplate(this,(this->m_stage).type);
  iVar6 = (*pIVar1->_vptr_IProgramContextSupplier[6])(pIVar1);
  pLVar9 = (LayoutBindingProgram *)CONCAT44(extraout_var_03,iVar6);
  iVar6 = (*pLVar9->_vptr_LayoutBindingProgram[2])(pLVar9);
  pSVar5 = pLVar9->m_program;
  if (iVar6 == 2) {
    if (((*pSVar5->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != true) goto LAB_00bc7f21;
LAB_00bc7eac:
    if ((pSVar5->m_program).m_info.linkOk != true) goto LAB_00bc7f21;
    LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&s,pLVar9,true);
    pLVar11 = local_2f8;
    local_2f8->m_passed = false;
    local_2f8->m_notRunForThisContext = false;
    (local_2f8->m_reason)._M_dataplus._M_p = (pointer)&(local_2f8->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8->m_reason,
               s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream,
               s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
               (long)s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                     _vptr_basic_ostream);
    if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)puVar3) {
      operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      CONCAT71(s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                               s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
    }
    pp_Var10 = pLVar9->_vptr_LayoutBindingProgram;
  }
  else {
    if (((*pSVar5->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != false) goto LAB_00bc7eac;
LAB_00bc7f21:
    (*pLVar9->_vptr_LayoutBindingProgram[1])(pLVar9);
    iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,*(char **)CONCAT44(extraout_var_04,iVar6),&local_33a);
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"-1","");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x19])
              (&local_250,this,&local_318);
    iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,*(char **)(CONCAT44(extraout_var_05,iVar6) + 0x18),&local_339);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_210,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_290,this,&local_210);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_2b0,this,0);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"float","");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_230,this,local_2b0,&local_2d0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_2f0,this,0);
    local_1f0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    local_1f0._M_dataplus._M_p = (pointer)paVar4;
    buildUniformDecl((String *)&s,this,&local_338,&local_250,&local_270,&local_290,&local_230,
                     &local_2f0,&local_1f0);
    std::__cxx11::string::operator=((string *)&decl,(string *)&s);
    if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)
           &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      CONCAT71(s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                               s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar4) {
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                               local_1f0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,
                      CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                               local_2f0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2b0[0] != local_2a0) {
      operator_delete(local_2b0[0],local_2a0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
    updateTemplate(this,(this->m_stage).type);
    iVar6 = (*pIVar1->_vptr_IProgramContextSupplier[6])(pIVar1);
    pLVar9 = (LayoutBindingProgram *)CONCAT44(extraout_var_06,iVar6);
    iVar6 = (*pLVar9->_vptr_LayoutBindingProgram[2])(pLVar9);
    pSVar5 = pLVar9->m_program;
    if (iVar6 != 2) {
      if (((*pSVar5->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != false)
      goto LAB_00bc82bf;
LAB_00bc8310:
      (*pLVar9->_vptr_LayoutBindingProgram[1])(pLVar9);
      iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_338,*(char **)CONCAT44(extraout_var_07,iVar6),
                 (allocator<char> *)&local_1f0);
      uVar7 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                (&local_250,this,(ulong)uVar7);
      iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_318,*(char **)(CONCAT44(extraout_var_08,iVar6) + 0x18),&local_33a)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_290,this,0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                (&local_270,this,&local_290);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_230,this,0);
      local_2b0[0] = local_2a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"float","");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                (&local_210,this,&local_230,local_2b0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_2d0,this,0);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      local_2f0._M_string_length = 0;
      local_2f0.field_2._M_local_buf[0] = '\0';
      buildUniformDecl((String *)&s,this,&local_338,&local_250,&local_318,&local_270,&local_210,
                       &local_2d0,&local_2f0);
      std::__cxx11::string::operator=((string *)&decl,(string *)&s);
      if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
          _vptr_basic_ostream !=
          (_func_int **)
          &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        CONCAT71(s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                 s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,
                        CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                                 local_2f0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (local_2b0[0] != local_2a0) {
        operator_delete(local_2b0[0],local_2a0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
      updateTemplate(this,(this->m_stage).type);
      iVar6 = (*pIVar1->_vptr_IProgramContextSupplier[6])(pIVar1);
      pLVar9 = (LayoutBindingProgram *)CONCAT44(extraout_var_09,iVar6);
      iVar6 = (*pLVar9->_vptr_LayoutBindingProgram[2])(pLVar9);
      pSVar5 = pLVar9->m_program;
      if (iVar6 == 2) {
        if (((*pSVar5->m_shaders[5].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_start)->m_info).compileOk == true) {
LAB_00bc866d:
          if ((pSVar5->m_program).m_info.linkOk == true) {
            LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&s,pLVar9,true);
            pLVar11 = local_2f8;
            local_2f8->m_passed = false;
            local_2f8->m_notRunForThisContext = false;
            (local_2f8->m_reason)._M_dataplus._M_p = (pointer)&(local_2f8->m_reason).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2f8->m_reason,
                       s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                       _vptr_basic_ostream,
                       s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                       _8_8_ + (long)s.super_ostringstream.
                                     super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream);
            goto LAB_00bc86b9;
          }
        }
      }
      else if (((*pSVar5->m_shaders[1].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_info).compileOk != false) goto LAB_00bc866d;
      (*pLVar9->_vptr_LayoutBindingProgram[1])(pLVar9);
      iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_338,*(char **)CONCAT44(extraout_var_10,iVar6),
                 (allocator<char> *)&local_1f0);
      uVar7 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                (&local_250,this,(ulong)uVar7);
      iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_318,*(char **)(CONCAT44(extraout_var_11,iVar6) + 0x18),&local_33a)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_290,this,0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                (&local_270,this,&local_290);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_230,this,0);
      local_2b0[0] = local_2a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"float","");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                (&local_210,this,&local_230,local_2b0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_2d0,this,0);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      local_2f0._M_string_length = 0;
      local_2f0.field_2._M_local_buf[0] = '\0';
      buildUniformDecl((String *)&s,this,&local_338,&local_250,&local_318,&local_270,&local_210,
                       &local_2d0,&local_2f0);
      std::__cxx11::string::operator=((string *)&decl,(string *)&s);
      puVar3 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      paVar2 = &local_338.field_2;
      if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
          _vptr_basic_ostream != (_func_int **)puVar3) {
        operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        CONCAT71(s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                 s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,
                        CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                                 local_2f0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (local_2b0[0] != local_2a0) {
        operator_delete(local_2b0[0],local_2a0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != paVar2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
      this_00 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
      ;
      std::ios_base::ios_base((ios_base *)this_00);
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
           glUniformMatrix3x2fv;
      s.super_ostringstream._328_8_ = 0;
      s.super_ostringstream._336_2_ = 0;
      s.super_ostringstream._344_8_ = 0;
      s.super_ostringstream._352_8_ = 0;
      s.super_ostringstream._360_8_ = 0;
      s.super_ostringstream._368_8_ = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)&PTR__StringStream_020f2a68;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
           &PTR__StringStream_020f2a90;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"vec4(0.0);\n",0xb);
      std::__cxx11::stringbuf::str();
      setTemplateParam(this,(this->m_stage).type,"UNIFORM_ACCESS",&local_338);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != paVar2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      updateTemplate(this,(this->m_stage).type);
      iVar6 = (*pIVar1->_vptr_IProgramContextSupplier[6])(pIVar1);
      pLVar9 = (LayoutBindingProgram *)CONCAT44(extraout_var_12,iVar6);
      iVar6 = (*pLVar9->_vptr_LayoutBindingProgram[2])(pLVar9);
      pSVar5 = pLVar9->m_program;
      if (iVar6 == 2) {
        if (((*pSVar5->m_shaders[5].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_start)->m_info).compileOk == true) {
LAB_00bc8b10:
          if ((pSVar5->m_program).m_info.linkOk == true) {
            LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_338,pLVar9,true);
            local_2f8->m_passed = false;
            local_2f8->m_notRunForThisContext = false;
            (local_2f8->m_reason)._M_dataplus._M_p = (pointer)&(local_2f8->m_reason).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2f8->m_reason,local_338._M_dataplus._M_p,
                       local_338._M_dataplus._M_p + local_338._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338._M_dataplus._M_p != paVar2) {
              operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1
                             );
            }
            (*pLVar9->_vptr_LayoutBindingProgram[1])(pLVar9);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
            std::ios_base::~ios_base((ios_base *)this_00);
            pLVar11 = local_2f8;
            goto LAB_00bc8c0c;
          }
        }
      }
      else if (((*pSVar5->m_shaders[1].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_info).compileOk != false) goto LAB_00bc8b10;
      (*pLVar9->_vptr_LayoutBindingProgram[1])(pLVar9);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base((ios_base *)this_00);
      pLVar11 = local_2f8;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
      local_2f8->m_passed = true;
      local_2f8->m_notRunForThisContext = false;
      (local_2f8->m_reason)._M_dataplus._M_p = (pointer)&(local_2f8->m_reason).field_2;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)puVar3;
      std::__cxx11::string::_M_construct<char*>((string *)&local_2f8->m_reason,puVar3,puVar3);
      if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
          _vptr_basic_ostream != (_func_int **)puVar3) {
        operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        CONCAT71(s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                 s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
      }
      goto LAB_00bc8c0c;
    }
    if (((*pSVar5->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != true) goto LAB_00bc8310;
LAB_00bc82bf:
    if ((pSVar5->m_program).m_info.linkOk != true) goto LAB_00bc8310;
    LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&s,pLVar9,true);
    pLVar11 = local_2f8;
    local_2f8->m_passed = false;
    local_2f8->m_notRunForThisContext = false;
    (local_2f8->m_reason)._M_dataplus._M_p = (pointer)&(local_2f8->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8->m_reason,
               s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream,
               s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
               (long)s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                     _vptr_basic_ostream);
LAB_00bc86b9:
    if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)
           &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      CONCAT71(s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                               s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
    }
    pp_Var10 = pLVar9->_vptr_LayoutBindingProgram;
  }
  (*pp_Var10[1])(pLVar9);
LAB_00bc8c0c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl._M_dataplus._M_p != &decl.field_2) {
    operator_delete(decl._M_dataplus._M_p,
                    CONCAT71(decl.field_2._M_allocated_capacity._1_7_,decl.field_2._M_local_buf[0])
                    + 1);
  }
  return pLVar11;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_compilation_errors(void)
{
	bool   passed = true;
	String decl;

	// verify "uniform float var;" doesn't compile
	{
		StringStream s;
		s << getTestParameters().vector_type << "(0.0);";

		setTemplateParam("UNIFORM_ACCESS", s.str());
		s.reset();
		s << "layout(binding=0) "
		  << "uniform float tex0;";
		setTemplateParam("UNIFORM_DECL", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}

	// verify that non-constant integer expression in binding fails
	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(String("0.0")),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}

	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(String("-1")),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}
	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(maxBindings()),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}
	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(maxBindings()),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);

		StringStream s;
		s << "vec4(0.0);\n";
		setTemplateParam("UNIFORM_ACCESS", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}
	return LayoutBindingTestResult(passed, String());
}